

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O0

block_t * __thiscall
plot::detail::braille::block_t::paint
          (block_t *__return_storage_ptr__,block_t *this,block_t *dst,TerminalOp op)

{
  float fVar1;
  undefined3 uVar2;
  TerminalOp op_local;
  block_t *dst_local;
  block_t *this_local;
  
  if (this->pixels != '\0') {
    if (op == Over) {
      over(__return_storage_ptr__,this,dst);
      return __return_storage_ptr__;
    }
    if (op == ClipDst) {
      fVar1 = (this->color).g;
      (__return_storage_ptr__->color).r = (this->color).r;
      (__return_storage_ptr__->color).g = fVar1;
      fVar1 = (this->color).a;
      (__return_storage_ptr__->color).b = (this->color).b;
      (__return_storage_ptr__->color).a = fVar1;
      uVar2 = *(undefined3 *)&this->field_0x11;
      __return_storage_ptr__->pixels = this->pixels;
      *(undefined3 *)&__return_storage_ptr__->field_0x11 = uVar2;
      return __return_storage_ptr__;
    }
    if ((op == ClipSrc) && (dst->pixels == '\0')) {
      fVar1 = (this->color).g;
      (__return_storage_ptr__->color).r = (this->color).r;
      (__return_storage_ptr__->color).g = fVar1;
      fVar1 = (this->color).a;
      (__return_storage_ptr__->color).b = (this->color).b;
      (__return_storage_ptr__->color).a = fVar1;
      uVar2 = *(undefined3 *)&this->field_0x11;
      __return_storage_ptr__->pixels = this->pixels;
      *(undefined3 *)&__return_storage_ptr__->field_0x11 = uVar2;
      return __return_storage_ptr__;
    }
  }
  fVar1 = (dst->color).g;
  (__return_storage_ptr__->color).r = (dst->color).r;
  (__return_storage_ptr__->color).g = fVar1;
  fVar1 = (dst->color).a;
  (__return_storage_ptr__->color).b = (dst->color).b;
  (__return_storage_ptr__->color).a = fVar1;
  uVar2 = *(undefined3 *)&dst->field_0x11;
  __return_storage_ptr__->pixels = dst->pixels;
  *(undefined3 *)&__return_storage_ptr__->field_0x11 = uVar2;
  return __return_storage_ptr__;
}

Assistant:

block_t paint(block_t const& dst, TerminalOp op) const {
            if (pixels) {
                switch (op) {
                    case TerminalOp::Over:
                        return over(dst);
                    case TerminalOp::ClipDst:
                        return *this;
                    case TerminalOp::ClipSrc:
                        if (!dst.pixels)
                            return *this;
                }
            }

            return dst;
        }